

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O1

int IntersectBoxRayHelper(ON_3dPoint *rst,ON_3dVector *n,int dir,double *s)

{
  double *pdVar1;
  int iVar2;
  double dVar3;
  undefined8 uVar4;
  ON_3dPoint local_b8;
  double local_98;
  undefined8 uStack_90;
  double local_88;
  undefined8 uStack_80;
  double local_78;
  undefined8 uStack_70;
  double local_68;
  ON_3dVector local_60;
  ON_3dVector local_48;
  
  local_98 = (&n->x)[(uint)dir];
  local_88 = -1.0 - (&rst->x)[(uint)dir];
  iVar2 = 0;
  if ((ABS(local_98) * 1e+100 <= ABS(local_88)) ||
     (local_78 = 1.0 - (&rst->x)[(uint)dir], ABS(local_98) * 1e+100 <= ABS(local_78))) {
    local_78 = -1.23432101234321e+308;
  }
  else {
    uStack_70 = 0;
    uStack_90 = 0;
    local_88 = local_88 / local_98;
    uStack_80 = 0;
    operator*(&local_60,local_88,n);
    ON_3dPoint::operator+(&local_b8,rst,&local_60);
    if (dir != 0) {
      local_68 = local_b8.x;
      pdVar1 = ON_3dPoint::operator[](&local_b8,dir);
      local_b8.x = *pdVar1;
      pdVar1 = ON_3dPoint::operator[](&local_b8,dir);
      *pdVar1 = local_68;
    }
    dVar3 = -1.23432101234321e+308;
    uVar4 = 0;
    if (ABS(local_b8.y) <= 1.0000000149011612 && ABS(local_b8.x + 1.0) <= 1.490116119385e-08) {
      dVar3 = (double)(-(ulong)(1.0000000149011612 < ABS(local_b8.z)) & 0xffe5f8bd9e331dd2 |
                      ~-(ulong)(1.0000000149011612 < ABS(local_b8.z)) & (ulong)local_88);
      uVar4 = uStack_80;
    }
    local_78 = local_78 / local_98;
    local_88 = dVar3;
    uStack_80 = uVar4;
    operator*(&local_48,local_78,n);
    ON_3dPoint::operator+((ON_3dPoint *)&local_60,rst,&local_48);
    local_b8.z = local_60.z;
    local_b8.x = local_60.x;
    local_b8.y = local_60.y;
    if (dir != 0) {
      local_98 = local_60.x;
      pdVar1 = ON_3dPoint::operator[](&local_b8,dir);
      local_b8.x = *pdVar1;
      pdVar1 = ON_3dPoint::operator[](&local_b8,dir);
      *pdVar1 = local_98;
    }
    if (((1.490116119385e-08 < ABS(local_b8.x + -1.0)) || (1.0000000149011612 < ABS(local_b8.y))) ||
       (1.0000000149011612 < ABS(local_b8.z))) {
      local_78 = -1.23432101234321e+308;
      if ((local_88 == -1.23432101234321e+308) && (iVar2 = 0, !NAN(local_88))) goto LAB_004dfd44;
    }
    if (((local_88 == -1.23432101234321e+308) && (!NAN(local_88))) ||
       ((local_88 < local_78 && local_88 < 0.0 || (0.0 <= local_78 && local_78 < local_88)))) {
      iVar2 = dir * 2 + 2;
    }
    else {
      iVar2 = dir * 2 + 1;
      local_78 = local_88;
    }
  }
LAB_004dfd44:
  *s = local_78;
  return iVar2;
}

Assistant:

static
int IntersectBoxRayHelper(const ON_3dPoint& rst, const ON_3dVector& n, int dir, double* s)
{
  /*
  returns:
    0 = ray parallel to sides
    1 = ray hit left side (x=-1)
    2 = ray hit right side (x=+1)
    3 = ray hit back side (y=-1)
    4 = ray hit front side (y=+1)
    5 = ray hit bottom side (z=-1)
    6 = ray hit top side (z=+1)
  */
  double nx = (&n.x)[dir];
  ON_3dPoint Q;
  double t,t0,t1;

  // protect against overflow
  t = fabs(nx)*on__overflow_tol;
  t0 = (-1.0 - (&rst.x)[dir]);
  t1 = ( 1.0 - (&rst.x)[dir]);
  if ( fabs(t0) >= t || fabs(t1) >= t )
  {
    *s = ON_UNSET_VALUE;
    return 0;
  }

  t0 /= nx;
  Q = rst + t0*n;
  if ( dir )
  {
    t = Q.x;
    Q.x = Q[dir];
    Q[dir] = t;
  }
  if ( fabs(Q.x+1.0) > ON_SQRT_EPSILON
        || Q.y < -(1.0+ON_SQRT_EPSILON) || Q.y > (1.0+ON_SQRT_EPSILON)
        || Q.z < -(1.0+ON_SQRT_EPSILON) || Q.z > (1.0+ON_SQRT_EPSILON)
        )
  {
    // The ray's intersection with the plane missed the
    // (-1,+1)x(-1,+1) square that is the side of the box.
    t0 = ON_UNSET_VALUE;
  }

  t1 /= nx;
  Q = rst + t1*n;
  if ( dir )
  {
    t = Q.x;
    Q.x = Q[dir];
    Q[dir] = t;
  }
  if ( fabs(Q.x-1.0) > ON_SQRT_EPSILON
        || Q.y < -(1.0+ON_SQRT_EPSILON) || Q.y > (1.0+ON_SQRT_EPSILON)
        || Q.z < -(1.0+ON_SQRT_EPSILON) || Q.z > (1.0+ON_SQRT_EPSILON)
        )
  {
    // The ray's intersection with the plane missed the
    // (-1,+1)x(-1,+1) square that is the side of the box.
    t1 = ON_UNSET_VALUE;
    if ( ON_UNSET_VALUE == t0 )
    {
      *s = ON_UNSET_VALUE;
      return 0;
    }
  }

  int rc;
  if ( ON_UNSET_VALUE == t0 || 1 == BestHitHelper(t0,t1) )
  {
    rc = 2 + 2*dir;
    *s = t1;
  }
  else
  {
    rc = 1 + 2*dir;
    *s = t0;
  }
  return rc;
}